

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

float lodepng::lodepng_powf(float x,float y)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  
  if ((x == 1.0) && (!NAN(x))) {
    return 1.0;
  }
  if ((y == 0.0) && (!NAN(y))) {
    return 1.0;
  }
  fVar5 = ABS(y);
  if (((x <= 0.0) || (3.4028235e+38 < x)) || (3.4028235e+38 < fVar5)) {
    if ((y == 1.0) && (!NAN(y))) {
      return x;
    }
    if (NAN(x) || NAN(y)) {
      return x + y;
    }
    if (0.0 < x) {
      if (3.4028235e+38 < x) {
        return (float)(-(uint)(0.0 < y) & (uint)x);
      }
    }
    else {
      uVar2 = 0;
      if (fVar5 <= 1.0737418e+09) {
        if (((float)(int)y != y) || (NAN((float)(int)y) || NAN(y))) {
          if (x < -3.4028235e+38) {
            return (float)(~-(uint)(y < 0.0) & (uint)lodepng_flt_inf);
          }
          if (x != 0.0) {
            return lodepng_flt_nan;
          }
          if (NAN(x)) {
            return lodepng_flt_nan;
          }
          bVar3 = y < 0.0;
          goto LAB_0011e0aa;
        }
        uVar2 = (uint)y;
        if ((uVar2 & 1) != 0) {
          if ((x == 0.0) && (!NAN(x))) {
            return (float)(~-(uint)(y < 0.0) & (uint)x | (uint)(1.0 / x) & -(uint)(y < 0.0));
          }
          fVar5 = lodepng_powf(-x,y);
          goto LAB_0011e120;
        }
      }
      if ((x == 0.0) && (!NAN(x))) {
        bVar3 = y <= 0.0;
LAB_0011e0aa:
        return (float)((uint)lodepng_flt_inf & -(uint)bVar3);
      }
      if (x < -3.4028235e+38) {
        if (y <= 0.0) {
          return 0.0;
        }
        fVar5 = lodepng_flt_inf;
        if ((uVar2 & 1) == 0) {
          return lodepng_flt_inf;
        }
LAB_0011e120:
        return -fVar5;
      }
      if ((x == -1.0) && (!NAN(x))) {
        return 1.0;
      }
      x = -x;
    }
    if (3.4028235e+38 < fVar5) {
      if (y <= 0.0 != x < 1.0) {
        return 0.0;
      }
      if (y < -y) {
        return -y;
      }
      return y;
    }
  }
  fVar5 = 0.0;
  for (; x < 1.5258789e-05; x = x * 65536.0) {
    fVar5 = fVar5 + -16.0;
  }
  for (; 65536.0 < x; x = x * 1.5258789e-05) {
    fVar5 = fVar5 + 16.0;
  }
  for (; x < 1.0; x = x + x) {
    fVar5 = fVar5 + -1.0;
  }
  for (; 2.0 < x; x = x * 0.5) {
    fVar5 = fVar5 + 1.0;
  }
  fVar5 = ((((x * 0.015339733 + 0.46614265) * x + -0.088363945) * x + -0.3931184) /
           ((x * 0.13722828 + 0.38889202) * x + 0.09074479) + fVar5) * y;
  if (128.0 <= ABS(fVar5)) {
    return (float)((uint)lodepng_flt_inf & -(uint)(0.0 < fVar5));
  }
  uVar2 = (uint)fVar5;
  fVar5 = fVar5 - (float)(int)fVar5;
  fVar4 = ((fVar5 * 0.0056350236 + 0.07284826) * fVar5 + 0.41777834) * fVar5 + 1.0;
  fVar5 = (fVar5 * 0.023501446 + -0.27537015) * fVar5 + 1.0;
  if ((int)uVar2 < -0x1e) {
    do {
      fVar4 = fVar4 * 4.656613e-10;
      uVar1 = uVar2 + 0x1f;
      bVar3 = uVar2 < 0xffffffc3;
      uVar2 = uVar1;
    } while (bVar3);
  }
  else {
    uVar1 = uVar2;
    if (0x1e < (int)uVar2) {
      do {
        fVar4 = fVar4 * 2.1474836e+09;
        uVar1 = uVar2 - 0x1f;
        bVar3 = 0x3d < uVar2;
        uVar2 = uVar1;
      } while (bVar3);
      goto LAB_0011dfc1;
    }
  }
  if ((int)uVar1 < 0) {
    return fVar4 / (fVar5 * (float)(1 << (-(char)uVar1 & 0x1fU)));
  }
LAB_0011dfc1:
  return ((float)(1 << ((byte)uVar1 & 0x1f)) * fVar4) / fVar5;
}

Assistant:

static float lodepng_powf(float x, float y) {
  float j, t0, t1;
  int i = 0;
  /* handle all the special floating point rules */
  if(x == 1 || y == 0) return 1;
  if(!(x > 0 && x <= lodepng_flt_max && y == y && y <= lodepng_flt_max && y >= -lodepng_flt_max)) {
    if(y == 1) return x; /* preserves negative-0 */
    if(x != x || y != y) return x + y; /* nan */
    if(x > 0) {
      if(x > lodepng_flt_max) return y <= 0 ? (y == 0 ? 1 : 0) : x; /* x = +infinity */
    } else {
      if(!(y < -1073741824.0f || y > 1073741824.0f)) { /* large y always even integer, but cast would overflow */
        i = (int)y;
        if(i != y) {
          return (x < -lodepng_flt_max) ? (y < 0 ? 0 : lodepng_flt_inf) :
              (x == 0 ? (y < 0 ? lodepng_flt_inf : 0) : lodepng_flt_nan);
        }
        if(i & 1) return x == 0 ? (y < 0 ? (1 / x) : x) : -lodepng_powf(-x, y);
      }
      if(x == 0) return y <= 0 ? lodepng_flt_inf : 0;
      if(x < -lodepng_flt_max) { /* x == -infinity */
        return y <= 0 ? (y == 0 ? 1 : 0) : ((i & 1) ?
            -lodepng_flt_inf : lodepng_flt_inf);
      }
      x = -x;
      if(x == 1) return 1;
    }
    if(y < -lodepng_flt_max || y > lodepng_flt_max) return ((x < 1) != (y > 0)) ? (y < 0 ? -y : y) : 0;
  }

  j = 0;
  while(x < (1.0f / 65536)) { j -= 16; x *= 65536.0f; }
  while(x > 65536) { j += 16; x *= (1.0f / 65536); }
  while(x < 1) { j--; x *= 2.0f; }
  while(x > 2) { j++; x *= 0.5f; }
  /* polynomial to approximate log2(x) with x in range 1..2 */
  t0 = -0.393118410458557f + x * (-0.0883639468229365f + x * (0.466142650227994f + x * 0.0153397331014276f));
  t1 = 0.0907447971403586f + x * (0.388892024755479f + x * 0.137228280305862f);
  x = t0 / t1 + j;

  x *= y; /* using the formula exp2(y * log2(x)) */

  if(!(x > -128.0f && x < 128.0f)) return x > 0 ? lodepng_flt_inf : 0; /* prevent int overflow */
  i = (int)x;
  x -= i;
  /* polynomial to approximate exp2(x) with x in range -1..1 */
  t0 = 1.0f + x * (0.41777833582744256f + x * (0.0728482595347711f + x * 0.005635023478609625f));
  t1 = 1.0f + x * (-0.27537016151408167f + x * 0.023501446055084033f);
  while(i <= -31) { t0 *= (1.0f / 2147483648.0f); i += 31; }
  while(i >= 31) { t0 *= 2147483648.0f; i -= 31; }
  return (i < 0) ? (t0 / (t1 * (1 << -i))) : ((t0 * (1 << i)) / t1);
}